

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O3

Vec_Int_t * Gia_ManTransfer(Gia_Man_t *pAig,Gia_Man_t *pCof,Gia_Man_t *pNew,Vec_Int_t *vSigs)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar4 = (int *)malloc(400);
  p->pArray = piVar4;
  iVar3 = vSigs->nSize;
  if (0 < iVar3) {
    lVar8 = 0;
    do {
      iVar2 = vSigs->pArray[lVar8];
      if (((long)iVar2 < 0) || (pAig->nObjs <= iVar2)) {
LAB_00666a35:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pAig->pObjs == (Gia_Obj_t *)0x0) {
        return p;
      }
      pGVar1 = pAig->pObjs + iVar2;
      uVar5 = *(uint *)pGVar1;
      uVar6 = ~uVar5;
      if (((uVar6 & 0x9fffffff) != 0) && ((int)uVar5 < 0 || (uVar6 & 0x1fffffff) == 0)) {
        __assert_fail("Gia_ObjIsCand(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCof.c"
                      ,0x395,
                      "Vec_Int_t *Gia_ManTransfer(Gia_Man_t *, Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)"
                     );
      }
      uVar5 = pGVar1->Value;
      if ((int)uVar5 < 0) {
LAB_00666a54:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10c,"int Abc_Lit2Var(int)");
      }
      uVar5 = uVar5 >> 1;
      if (pCof->nObjs <= (int)uVar5) goto LAB_00666a35;
      uVar5 = pCof->pObjs[uVar5].Value;
      if (1 < uVar5 + 1) {
        if ((int)uVar5 < 0) goto LAB_00666a54;
        if (0 < (long)p->nSize) {
          lVar7 = 0;
          do {
            if (p->pArray[lVar7] == uVar5 >> 1) goto LAB_00666a19;
            lVar7 = lVar7 + 1;
          } while (p->nSize != lVar7);
        }
        Vec_IntPush(p,uVar5 >> 1);
        iVar3 = vSigs->nSize;
      }
LAB_00666a19:
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar3);
  }
  return p;
}

Assistant:

Vec_Int_t * Gia_ManTransfer( Gia_Man_t * pAig, Gia_Man_t * pCof, Gia_Man_t * pNew, Vec_Int_t * vSigs )
{
    Vec_Int_t * vSigsNew;
    Gia_Obj_t * pObj, * pObjF;
    int i;
    vSigsNew = Vec_IntAlloc( 100 );
    Gia_ManForEachObjVec( vSigs, pAig, pObj, i )
    {
        assert( Gia_ObjIsCand(pObj) );
        pObjF = Gia_ManObj( pCof, Abc_Lit2Var(pObj->Value) );
        if ( pObjF->Value && ~pObjF->Value )
            Vec_IntPushUnique( vSigsNew, Abc_Lit2Var(pObjF->Value) );
    }
    return vSigsNew;    
}